

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseVectorOrArrayTypeSuffixes
          (StructuralParser *this,Expression *elementType,ParseTypeContext parseContext)

{
  bool bVar1;
  Expression *args_2;
  SubscriptWithChevrons *t;
  SubscriptWithChevrons *e;
  char *local_80;
  UTF8Reader local_78;
  char *local_70;
  undefined1 local_68 [8];
  pool_ptr<soul::AST::Expression> size;
  UTF8Reader startPos;
  Context context;
  ParseTypeContext parseContext_local;
  Expression *elementType_local;
  StructuralParser *this_local;
  
  getContext((Context *)&startPos,this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::getCurrentTokeniserPosition
            ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              *)&stack0xffffffffffffffb8);
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4aecc4);
  if (!bVar1) {
    this_local = (StructuralParser *)parseArrayTypeSuffixes(this,elementType,parseContext);
    size.object._0_4_ = 1;
    goto LAB_00371495;
  }
  this->ignoreGreaterThanToken = this->ignoreGreaterThanToken + 1;
  tryToParseExpressionIgnoringErrors((StructuralParser *)local_68);
  this->ignoreGreaterThanToken = this->ignoreGreaterThanToken + -1;
  bVar1 = pool_ptr<soul::AST::Expression>::operator==
                    ((pool_ptr<soul::AST::Expression> *)local_68,(void *)0x0);
  if (bVar1) {
LAB_00371343:
    UTF8Reader::UTF8Reader(&local_78,(UTF8Reader *)&stack0xffffffffffffffb8);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::resetPosition(&this->super_SOULTokeniser,&local_78);
    this_local = (StructuralParser *)elementType;
  }
  else {
    local_70 = ">";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d4b9a);
    if (!bVar1) goto LAB_00371343;
    local_80 = "<";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x4aecc4);
    if (bVar1) {
      Errors::wrongTypeForVectorElement<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&e);
      CompileMessage::~CompileMessage((CompileMessage *)&e);
    }
    args_2 = pool_ptr<soul::AST::Expression>::operator*((pool_ptr<soul::AST::Expression> *)local_68)
    ;
    t = allocate<soul::AST::SubscriptWithChevrons,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                  (this,(Context *)&startPos,elementType,args_2);
    this_local = (StructuralParser *)parseArrayTypeSuffixes(this,&t->super_Expression,parseContext);
  }
  size.object._0_4_ = 1;
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_68);
LAB_00371495:
  AST::Context::~Context((Context *)&startPos);
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseVectorOrArrayTypeSuffixes (AST::Expression& elementType, ParseTypeContext parseContext)
    {
        auto context = getContext();
        auto startPos = getCurrentTokeniserPosition();

        if (! matchIf (Operator::lessThan))
            return parseArrayTypeSuffixes (elementType, parseContext);

        ++ignoreGreaterThanToken;
        auto size = tryToParseExpressionIgnoringErrors();
        --ignoreGreaterThanToken;

        if (size == nullptr || ! matchIf (Operator::greaterThan))
        {
            resetPosition (startPos);
            return elementType;
        }

        if (matches (Operator::lessThan))
            throwError (Errors::wrongTypeForVectorElement());

        auto& e = allocate<AST::SubscriptWithChevrons> (context, elementType, *size);
        return parseArrayTypeSuffixes (e, parseContext);
    }